

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O3

void kv_copy_var_nentry_test(btree_kv_ops *kv_ops)

{
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var1;
  _func_void_bnode_ptr_bnode_ptr_idx_t_idx_t_idx_t *p_Var2;
  char cVar3;
  int iVar4;
  bnode *__ptr;
  bnode *__ptr_00;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  undefined8 auStack_c0 [13];
  undefined1 local_58 [8];
  timeval __test_begin;
  char local_33;
  char local_32;
  char local_31 [7];
  uint8_t v_out;
  uint8_t v;
  
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  memleak_start();
  __ptr = (bnode *)malloc(0x1010);
  __ptr->kvsize = 0x801;
  __ptr->flag = 0;
  __ptr->level = 1;
  __ptr->nentry = 10;
  (__ptr->field_4).data = __ptr + 1;
  local_31[0] = 'd';
  uVar8 = 0;
  pcVar6 = (char *)(auStack_c0 + 3);
  do {
    pcVar5 = pcVar6;
    pcVar6 = pcVar5 + -0x10;
    auStack_c0[uVar8 + 3] = pcVar6;
    builtin_strncpy(pcVar5 + -0x18,"i<\x10",4);
    pcVar5[-0x14] = '\0';
    pcVar5[-0x13] = '\0';
    pcVar5[-0x12] = '\0';
    pcVar5[-0x11] = '\0';
    sprintf(pcVar6,"key%d",uVar8 & 0xffffffff);
    p_Var1 = kv_ops->set_kv;
    builtin_strncpy(pcVar5 + -0x18,"z<\x10",4);
    pcVar5[-0x14] = '\0';
    pcVar5[-0x13] = '\0';
    pcVar5[-0x12] = '\0';
    pcVar5[-0x11] = '\0';
    (*p_Var1)(__ptr,(idx_t)uVar8,pcVar6,local_31);
    local_31[0] = local_31[0] + '\x01';
    uVar8 = uVar8 + 1;
  } while (uVar8 != 10);
  pcVar5[-0x18] = -0x70;
  pcVar5[-0x17] = '<';
  pcVar5[-0x16] = '\x10';
  pcVar5[-0x15] = '\0';
  pcVar5[-0x14] = '\0';
  pcVar5[-0x13] = '\0';
  pcVar5[-0x12] = '\0';
  pcVar5[-0x11] = '\0';
  __ptr_00 = (bnode *)malloc(0x1010);
  __ptr_00->kvsize = 0x801;
  __ptr_00->flag = 0;
  __ptr_00->level = 1;
  __ptr_00->nentry = 0;
  (__ptr_00->field_4).data = __ptr_00 + 1;
  lVar7 = 0;
  p_Var2 = kv_ops->copy_kv;
  pcVar5[-0x18] = -0x3b;
  pcVar5[-0x17] = '<';
  pcVar5[-0x16] = '\x10';
  pcVar5[-0x15] = '\0';
  pcVar5[-0x14] = '\0';
  pcVar5[-0x13] = '\0';
  pcVar5[-0x12] = '\0';
  pcVar5[-0x11] = '\0';
  (*p_Var2)(__ptr_00,__ptr,0,5,5);
  local_31[0] = 'i';
  do {
    p_Var1 = kv_ops->get_kv;
    pcVar5[-0x18] = -0x20;
    pcVar5[-0x17] = '<';
    pcVar5[-0x16] = '\x10';
    pcVar5[-0x15] = '\0';
    pcVar5[-0x14] = '\0';
    pcVar5[-0x13] = '\0';
    pcVar5[-0x12] = '\0';
    pcVar5[-0x11] = '\0';
    (*p_Var1)(__ptr_00,(idx_t)lVar7,&__test_begin.tv_usec,&local_32);
    pcVar6 = (char *)auStack_c0[lVar7 + 8];
    pcVar5[-0x18] = -0x10;
    pcVar5[-0x17] = '<';
    pcVar5[-0x16] = '\x10';
    pcVar5[-0x15] = '\0';
    pcVar5[-0x14] = '\0';
    pcVar5[-0x13] = '\0';
    pcVar5[-0x12] = '\0';
    pcVar5[-0x11] = '\0';
    iVar4 = strcmp((char *)&__test_begin.tv_usec,pcVar6);
    if (iVar4 != 0) {
      builtin_strncpy(pcVar5 + -0x18,"\x17=\x10",4);
      pcVar5[-0x14] = '\0';
      pcVar5[-0x13] = '\0';
      pcVar5[-0x12] = '\0';
      pcVar5[-0x11] = '\0';
      kv_copy_var_nentry_test();
    }
    cVar3 = local_32;
    if (local_32 != local_31[0]) {
      builtin_strncpy(pcVar5 + -0x18,"*=\x10",4);
      pcVar5[-0x14] = '\0';
      pcVar5[-0x13] = '\0';
      pcVar5[-0x12] = '\0';
      pcVar5[-0x11] = '\0';
      kv_copy_var_nentry_test();
      cVar3 = local_33;
    }
    local_31[0] = cVar3 + '\x01';
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  lVar7 = 0;
  p_Var2 = kv_ops->copy_kv;
  builtin_strncpy(pcVar5 + -0x18,"I=\x10",4);
  pcVar5[-0x14] = '\0';
  pcVar5[-0x13] = '\0';
  pcVar5[-0x12] = '\0';
  pcVar5[-0x11] = '\0';
  (*p_Var2)(__ptr_00,__ptr,5,0,10);
  local_31[0] = 'd';
  do {
    p_Var1 = kv_ops->get_kv;
    builtin_strncpy(pcVar5 + -0x18,"h=\x10",4);
    pcVar5[-0x14] = '\0';
    pcVar5[-0x13] = '\0';
    pcVar5[-0x12] = '\0';
    pcVar5[-0x11] = '\0';
    (*p_Var1)(__ptr_00,(short)lVar7 + 5,&__test_begin.tv_usec,&local_32);
    pcVar6 = (char *)auStack_c0[lVar7 + 3];
    builtin_strncpy(pcVar5 + -0x18,"{=\x10",4);
    pcVar5[-0x14] = '\0';
    pcVar5[-0x13] = '\0';
    pcVar5[-0x12] = '\0';
    pcVar5[-0x11] = '\0';
    iVar4 = strcmp((char *)&__test_begin.tv_usec,pcVar6);
    if (iVar4 != 0) {
      pcVar5[-0x18] = -0x5e;
      pcVar5[-0x17] = '=';
      pcVar5[-0x16] = '\x10';
      pcVar5[-0x15] = '\0';
      pcVar5[-0x14] = '\0';
      pcVar5[-0x13] = '\0';
      pcVar5[-0x12] = '\0';
      pcVar5[-0x11] = '\0';
      kv_copy_var_nentry_test();
    }
    cVar3 = local_32;
    if (local_32 != local_31[0]) {
      pcVar5[-0x18] = -0x4b;
      pcVar5[-0x17] = '=';
      pcVar5[-0x16] = '\x10';
      pcVar5[-0x15] = '\0';
      pcVar5[-0x14] = '\0';
      pcVar5[-0x13] = '\0';
      pcVar5[-0x12] = '\0';
      pcVar5[-0x11] = '\0';
      kv_copy_var_nentry_test();
      cVar3 = local_33;
    }
    local_31[0] = cVar3 + '\x01';
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  lVar7 = 0;
  p_Var2 = kv_ops->copy_kv;
  pcVar5[-0x18] = -0x2f;
  pcVar5[-0x17] = '=';
  pcVar5[-0x16] = '\x10';
  pcVar5[-0x15] = '\0';
  pcVar5[-0x14] = '\0';
  pcVar5[-0x13] = '\0';
  pcVar5[-0x12] = '\0';
  pcVar5[-0x11] = '\0';
  (*p_Var2)(__ptr_00,__ptr,0,0,10);
  local_31[0] = 'd';
  do {
    p_Var1 = kv_ops->get_kv;
    pcVar5[-0x18] = -0x14;
    pcVar5[-0x17] = '=';
    pcVar5[-0x16] = '\x10';
    pcVar5[-0x15] = '\0';
    pcVar5[-0x14] = '\0';
    pcVar5[-0x13] = '\0';
    pcVar5[-0x12] = '\0';
    pcVar5[-0x11] = '\0';
    (*p_Var1)(__ptr_00,(idx_t)lVar7,&__test_begin.tv_usec,&local_32);
    pcVar6 = (char *)auStack_c0[lVar7 + 3];
    pcVar5[-0x18] = -1;
    pcVar5[-0x17] = '=';
    pcVar5[-0x16] = '\x10';
    pcVar5[-0x15] = '\0';
    pcVar5[-0x14] = '\0';
    pcVar5[-0x13] = '\0';
    pcVar5[-0x12] = '\0';
    pcVar5[-0x11] = '\0';
    iVar4 = strcmp((char *)&__test_begin.tv_usec,pcVar6);
    if (iVar4 != 0) {
      builtin_strncpy(pcVar5 + -0x18,"&>\x10",4);
      pcVar5[-0x14] = '\0';
      pcVar5[-0x13] = '\0';
      pcVar5[-0x12] = '\0';
      pcVar5[-0x11] = '\0';
      kv_copy_var_nentry_test();
    }
    cVar3 = local_32;
    if (local_32 != local_31[0]) {
      builtin_strncpy(pcVar5 + -0x18,"9>\x10",4);
      pcVar5[-0x14] = '\0';
      pcVar5[-0x13] = '\0';
      pcVar5[-0x12] = '\0';
      pcVar5[-0x11] = '\0';
      kv_copy_var_nentry_test();
      cVar3 = local_33;
    }
    local_31[0] = cVar3 + '\x01';
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  builtin_strncpy(pcVar5 + -0x18,"G>\x10",4);
  pcVar5[-0x14] = '\0';
  pcVar5[-0x13] = '\0';
  pcVar5[-0x12] = '\0';
  pcVar5[-0x11] = '\0';
  free(__ptr);
  builtin_strncpy(pcVar5 + -0x18,"O>\x10",4);
  pcVar5[-0x14] = '\0';
  pcVar5[-0x13] = '\0';
  pcVar5[-0x12] = '\0';
  pcVar5[-0x11] = '\0';
  free(__ptr_00);
  builtin_strncpy(pcVar5 + -0x18,"T>\x10",4);
  pcVar5[-0x14] = '\0';
  pcVar5[-0x13] = '\0';
  pcVar5[-0x12] = '\0';
  pcVar5[-0x11] = '\0';
  memleak_end();
  pcVar6 = "%s PASSED\n";
  if (kv_copy_var_nentry_test(btree_kv_ops*)::__test_pass != '\0') {
    pcVar6 = "%s FAILED\n";
  }
  pcVar5[-0x18] = -0x7b;
  pcVar5[-0x17] = '>';
  pcVar5[-0x16] = '\x10';
  pcVar5[-0x15] = '\0';
  pcVar5[-0x14] = '\0';
  pcVar5[-0x13] = '\0';
  pcVar5[-0x12] = '\0';
  pcVar5[-0x11] = '\0';
  fprintf(_stderr,pcVar6,"kv_copy_var_nentry_test");
  return;
}

Assistant:

void kv_copy_var_nentry_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node, node_dst;
    uint8_t v, v_out;
    idx_t idx, src_idx, dst_idx, len;
    int n=10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    char **key = alca(char*, n);
    char *k_out = alca(char, ksize);

    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    // set n items into source node
    for (idx = 0; idx < n; idx++){
        key[idx] = alca(char, ksize);
        sprintf(key[idx], "key%d", idx);
        kv_ops->set_kv(node, idx, key[idx], (void *)&v);
        v++;
    }

    // copy n/2 entries into dest node
    src_idx = n/2;
    dst_idx = 0;
    len = src_idx;
    node_dst = dummy_node(ksize, vsize, 1);
    kv_ops->copy_kv(node_dst, node, dst_idx, src_idx, len);

    // verify
    v = 100 + n/2;
    for (idx = 0; idx < n/2; idx++){

        kv_ops->get_kv(node_dst, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx + n/2])));
        TEST_CHK(v_out == v);
        v++;

    }

    // append n entries into dst node
    dst_idx = src_idx;
    src_idx = 0;
    kv_ops->copy_kv(node_dst, node, dst_idx, src_idx, n);

    // verify
    v = 100;
    for (idx = n/2; idx < n+n/2; idx++){

        kv_ops->get_kv(node_dst, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx - n/2])));
        TEST_CHK(v_out == v);
        v++;
    }

    // prepend n entries into dst node
    dst_idx = 0;
    src_idx = 0;
    kv_ops->copy_kv(node_dst, node, dst_idx, src_idx, n);

    // verify
    v = 100;
    for (idx = src_idx; idx < n; idx++){

        kv_ops->get_kv(node_dst, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx])));
        TEST_CHK(v_out == v);
        v++;
    }

    free(node); free(node_dst);

    memleak_end();
    TEST_RESULT("kv_copy_var_nentry_test");
}